

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int ctl_lookupbymib(tsdn_t *tsdn,ctl_named_node_t **ending_nodep,size_t *mib,size_t miblen)

{
  ctl_node_t *pcVar1;
  ctl_named_node_t *pcVar2;
  ctl_named_node_t *children;
  size_t sVar3;
  
  if (miblen == 0) {
    pcVar2 = super_root_node;
  }
  else {
    pcVar2 = super_root_node;
    sVar3 = 0;
    do {
      pcVar1 = pcVar2->children;
      if (pcVar1->named == true) {
        if (pcVar2->nchildren <= mib[sVar3]) {
          return 2;
        }
        pcVar2 = (ctl_named_node_t *)(pcVar1 + mib[sVar3] * 0x28);
      }
      else {
        pcVar2 = (ctl_named_node_t *)(**(code **)(pcVar1 + 8))(tsdn,mib,miblen);
        if (pcVar2 == (ctl_named_node_t *)0x0) {
          return 2;
        }
      }
      sVar3 = sVar3 + 1;
    } while (miblen != sVar3);
  }
  *ending_nodep = pcVar2;
  return 0;
}

Assistant:

static int
ctl_lookupbymib(tsdn_t *tsdn, const ctl_named_node_t **ending_nodep,
    const size_t *mib, size_t miblen) {
	int ret;

	const ctl_named_node_t *node = super_root_node;
	for (size_t i = 0; i < miblen; i++) {
		assert(node);
		assert(node->nchildren > 0);
		if (ctl_named_node(node->children) != NULL) {
			/* Children are named. */
			if (node->nchildren <= mib[i]) {
				ret = ENOENT;
				goto label_return;
			}
			node = ctl_named_children(node, mib[i]);
		} else {
			const ctl_indexed_node_t *inode;

			/* Indexed element. */
			inode = ctl_indexed_node(node->children);
			node = inode->index(tsdn, mib, miblen, mib[i]);
			if (node == NULL) {
				ret = ENOENT;
				goto label_return;
			}
		}
	}
	assert(ending_nodep != NULL);
	*ending_nodep = node;
	ret = 0;

label_return:
	return(ret);
}